

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool computeScatterDataRegressionError(HighsScatterData *scatter_data,bool print)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  byte in_SIL;
  int *in_RDI;
  double dVar4;
  double dVar5;
  double error_1;
  double predicted_value1_1;
  double value1_1;
  double value0_1;
  HighsInt point_1;
  double sum_linear_error;
  double error;
  double predicted_value1;
  double value1;
  double value0;
  HighsInt point;
  double sum_log_error;
  undefined7 local_70;
  undefined1 in_stack_ffffffffffffff97;
  double *in_stack_ffffffffffffff98;
  double *predicted_value1_00;
  double in_stack_ffffffffffffffa0;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar7;
  double local_50;
  double local_40;
  uint local_24;
  double local_20;
  bool local_1;
  
  bVar1 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    local_1 = false;
  }
  else if (in_RDI[1] < *in_RDI) {
    local_1 = false;
  }
  else {
    local_20 = 0.0;
    if (bVar1 != 0) {
      printf("Log regression\nPoint     Value0     Value1 PredValue1      Error\n");
    }
    for (local_24 = 0; (int)local_24 < *in_RDI; local_24 = local_24 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),
                          (long)(int)local_24);
      vVar6 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                          (long)(int)local_24);
      dVar5 = *pvVar3;
      bVar2 = predictFromScatterData
                        ((HighsScatterData *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         (bool)in_stack_ffffffffffffff97);
      if (bVar2) {
        dVar4 = ABS(local_40 - dVar5);
        if (bVar1 != 0) {
          printf("%5d %10.4g %10.4g %10.4g %10.4g\n",vVar6,SUB84(dVar5,0),local_40,dVar4,
                 (ulong)local_24);
        }
        local_20 = dVar4 + local_20;
      }
    }
    if (bVar1 != 0) {
      printf("                                       %10.4g\n",local_20);
    }
    local_50 = 0.0;
    if (bVar1 != 0) {
      printf("Linear regression\nPoint     Value0     Value1 PredValue1      Error\n");
    }
    for (uVar7 = 0; (int)uVar7 < *in_RDI; uVar7 = uVar7 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),(long)(int)uVar7);
      vVar6 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)(int)uVar7)
      ;
      predicted_value1_00 = (double *)*pvVar3;
      bVar2 = predictFromScatterData
                        ((HighsScatterData *)CONCAT44(uVar7,in_stack_ffffffffffffffa8),vVar6,
                         predicted_value1_00,(bool)in_stack_ffffffffffffff97);
      if (bVar2) {
        dVar5 = ABS((double)CONCAT17(in_stack_ffffffffffffff97,local_70) -
                    (double)predicted_value1_00);
        if (bVar1 != 0) {
          printf("%5d %10.4g %10.4g %10.4g %10.4g\n",vVar6,(int)predicted_value1_00,
                 CONCAT17(in_stack_ffffffffffffff97,local_70),dVar5,(ulong)uVar7);
        }
        local_50 = dVar5 + local_50;
      }
    }
    if (bVar1 != 0) {
      printf("                                       %10.4g\n",local_50);
    }
    *(double *)(in_RDI + 0x1c) = local_20;
    *(double *)(in_RDI + 0x16) = local_50;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool computeScatterDataRegressionError(HighsScatterData& scatter_data,
                                       const bool print) {
  if (!scatter_data.have_regression_coeff_) return false;
  if (scatter_data.num_point_ < scatter_data.max_num_point_) return false;
  double sum_log_error = 0;
  if (print)
    printf(
        "Log regression\nPoint     Value0     Value1 PredValue1      Error\n");
  for (HighsInt point = 0; point < scatter_data.max_num_point_; point++) {
    double value0 = scatter_data.value0_[point];
    double value1 = scatter_data.value1_[point];
    double predicted_value1;
    if (predictFromScatterData(scatter_data, value0, predicted_value1, true)) {
      double error = fabs(predicted_value1 - value1);  // / fabs(value1);
      if (
          //	10*error > awful_regression_error &&
          print)
        printf("%5" HIGHSINT_FORMAT " %10.4g %10.4g %10.4g %10.4g\n", point,
               value0, value1, predicted_value1, error);
      sum_log_error += error;
    }
  }
  if (print)
    printf("                                       %10.4g\n", sum_log_error);
  double sum_linear_error = 0;
  if (print)
    printf(
        "Linear regression\nPoint     Value0     Value1 PredValue1      "
        "Error\n");
  for (HighsInt point = 0; point < scatter_data.max_num_point_; point++) {
    double value0 = scatter_data.value0_[point];
    double value1 = scatter_data.value1_[point];
    double predicted_value1;
    if (predictFromScatterData(scatter_data, value0, predicted_value1)) {
      double error = fabs(predicted_value1 - value1);  //  / fabs(value1);
      if (
          //	10*error > awful_regression_error &&
          print)
        printf("%5" HIGHSINT_FORMAT " %10.4g %10.4g %10.4g %10.4g\n", point,
               value0, value1, predicted_value1, error);
      sum_linear_error += error;
    }
  }
  if (print)
    printf("                                       %10.4g\n", sum_linear_error);
  scatter_data.log_regression_error_ = sum_log_error;
  scatter_data.linear_regression_error_ = sum_linear_error;
  return true;
}